

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  XYZ Ref;
  ELLIPSOID type_00;
  ELLIPSOID type_01;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  FILE *__stream;
  char *pcVar4;
  allocator aStack_17431;
  int desc;
  int port;
  double dStack_17428;
  double dStack_17420;
  double dStack_17418;
  double dStack_17410;
  double dStack_17408;
  double dStack_17400;
  double dStack_173f8;
  double dStack_173f0;
  double dStack_173e8;
  double dStack_173e0;
  double dStack_173d8;
  double dStack_173d0;
  XYZ XStack_173c0;
  string port_;
  string command;
  ELLIPSOID type_1;
  string sStack_17338;
  string sStack_17318;
  ELLIPSOID type;
  SPP SppSolver;
  SatPos Solver;
  ReadData_conflict decoder;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Usage: -i [IP address] [port]\n       -f [Binary File Path]");
    std::endl<char,std::char_traits<char>>(poVar3);
    return 1;
  }
  std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&decoder);
  bVar1 = std::operator==(&command,"-f");
  if (bVar1) {
    if ((uint)argc < 4 && argc != 2) {
      __stream = fopen(argv[2],"rb");
      ELLIPSOID::ELLIPSOID(&type);
      if (__stream == (FILE *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"open file error");
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(-1);
      }
      ReadData::ReadData((ReadData *)&decoder);
      while (iVar2 = feof(__stream), iVar2 == 0) {
        iVar2 = ReadData::decode((ReadData *)&decoder,(FILE *)__stream);
        if (iVar2 == 0) {
          SatPos::SatPos(&Solver);
          SPPResult::SPPResult(&SppSolver.result);
          dStack_173d8 = type.e2;
          dStack_173d0 = type.e1_2;
          dStack_173e8 = type.c;
          dStack_173e0 = type.alpha;
          dStack_173f8 = type.a;
          dStack_173f0 = type.b;
          std::__cxx11::string::string((string *)&sStack_17318,"./",(allocator *)&type_1);
          type_00.b = dStack_173f0;
          type_00.a = dStack_173f8;
          type_00.c = dStack_173e8;
          type_00.alpha = dStack_173e0;
          type_00.e2 = dStack_173d8;
          type_00.e1_2 = dStack_173d0;
          solve(&Solver,(SPP *)&SppSolver.result,(ReadData *)&decoder,type_00,&sStack_17318);
          std::__cxx11::string::~string((string *)&sStack_17318);
        }
      }
      iVar2 = 0;
      goto LAB_001065c5;
    }
    pcVar4 = "Usage: -f [Binary File Path]";
  }
  else {
    bVar1 = std::operator==(&command,"-i");
    if (bVar1) {
      if (argc == 4) {
        std::__cxx11::string::string((string *)&port_,argv[3],(allocator *)&decoder);
        std::__cxx11::stringstream::stringstream((stringstream *)&type);
        std::operator<<((ostream *)&type.c,(string *)&port_);
        std::istream::operator>>((istream *)&type,&port);
        pcVar4 = argv[2];
        ReadData::ReadData((ReadData *)&decoder);
        desc = 0;
        iVar2 = ReadData::OpenSocket((ReadData *)&decoder,pcVar4,port,&desc);
        if (iVar2 == 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"waiting for data ...");
          std::endl<char,std::char_traits<char>>(poVar3);
          do {
            do {
              iVar2 = ReadData::decode((ReadData *)&decoder,desc);
            } while (iVar2 != 0);
            ELLIPSOID::ELLIPSOID(&type_1);
            SatPos::SatPos(&Solver);
            SPPResult::SPPResult(&SppSolver.result);
            XYZ::XYZ(&XStack_173c0,-2267800.069,5009341.6472,3220989.9179);
            Ref.Y = XStack_173c0.Y;
            Ref.X = XStack_173c0.X;
            Ref.Z = XStack_173c0.Z;
            SPP::setRefPos((SPP *)&SppSolver.result,Ref);
            dStack_17408 = type_1.e2;
            dStack_17400 = type_1.e1_2;
            dStack_17418 = type_1.c;
            dStack_17410 = type_1.alpha;
            dStack_17428 = type_1.a;
            dStack_17420 = type_1.b;
            std::__cxx11::string::string((string *)&sStack_17338,"./",&aStack_17431);
            type_01.b = dStack_17420;
            type_01.a = dStack_17428;
            type_01.c = dStack_17418;
            type_01.alpha = dStack_17410;
            type_01.e2 = dStack_17408;
            type_01.e1_2 = dStack_17400;
            solve(&Solver,(SPP *)&SppSolver.result,(ReadData *)&decoder,type_01,&sStack_17338);
            std::__cxx11::string::~string((string *)&sStack_17338);
          } while( true );
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&type);
        std::__cxx11::string::~string((string *)&port_);
        goto LAB_001065c5;
      }
      pcVar4 = "Usage: -i [IP address] [port]\n";
    }
    else {
      pcVar4 = "Usage: -i [IP address] [port]\n       -f [Binary File Path]";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = 1;
LAB_001065c5:
  std::__cxx11::string::~string((string *)&command);
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
    if(argc <= 1) {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    string command = argv[1];

    if(command == "-f") {
        if(argc < 3 || argc >= 4) {
            cout << "Usage: -f [Binary File Path]" << endl;
            return 1;
        }
            
        char* filePath = argv[2];
        FILE* file = fopen(filePath, "rb");
        ELLIPSOID type;
        if(file == NULL) {
            cout << "open file error" << endl;
            exit(-1);
        }
        ReadData decoder;
        while(!feof(file)) {
            int flag = decoder.decode(file);
            if(flag != 0) 
                continue;
            SatPos Solver;
            SPP SppSolver;
            solve(Solver, SppSolver, decoder, type);
        }
        return 0;
    }

    else if(command == "-i") {
        if(argc < 4 || argc >= 5) {
            cout << "Usage: -i [IP address] [port]\n" << endl;
            return 1;
        }
        string port_ = argv[3];
        stringstream tmp;
        tmp << port_;
        int port;
        tmp >> port;
        char* ip = argv[2];

        ReadData decoder;
        int desc = 0;
        int flag = decoder.OpenSocket(ip, port, desc);
        if(flag != 0)
            return flag;
        cout << "waiting for data ..." << endl;
        while (true) {
            flag = decoder.decode(desc);
            if(flag != 0)
                continue;
            ELLIPSOID type;
            SatPos Solver;
            SPP SppSolver;
            SppSolver.setRefPos(XYZ(-2267800.0690, 5009341.6472, 3220989.9179));
            solve(Solver, SppSolver, decoder, type);
        }
    }
    else {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    
}